

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint8 *puVar1;
  jpgd_block_t *pjVar2;
  jpeg_decoder *in_RDI;
  int i;
  bool in_stack_00000027;
  size_t in_stack_00000028;
  jpeg_decoder *in_stack_00000030;
  jpgd_status status;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar3;
  
  status = (jpgd_status)((ulong)in_RDI >> 0x20);
  if (in_RDI->m_comps_in_frame == 1) {
    if ((in_RDI->m_comp_h_samp[0] != 1) || (in_RDI->m_comp_v_samp[0] != 1)) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                    status);
    }
    in_RDI->m_scan_type = 0;
    in_RDI->m_max_blocks_per_mcu = 1;
    in_RDI->m_max_mcu_x_size = 8;
    in_RDI->m_max_mcu_y_size = 8;
  }
  else {
    if (in_RDI->m_comps_in_frame != 3) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                    status);
    }
    if ((((in_RDI->m_comp_h_samp[1] != 1) || (in_RDI->m_comp_v_samp[1] != 1)) ||
        (in_RDI->m_comp_h_samp[2] != 1)) || (in_RDI->m_comp_v_samp[2] != 1)) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                    status);
    }
    if ((in_RDI->m_comp_h_samp[0] == 1) && (in_RDI->m_comp_v_samp[0] == 1)) {
      in_RDI->m_scan_type = 1;
      in_RDI->m_max_blocks_per_mcu = 3;
      in_RDI->m_max_mcu_x_size = 8;
      in_RDI->m_max_mcu_y_size = 8;
    }
    else if ((in_RDI->m_comp_h_samp[0] == 2) && (in_RDI->m_comp_v_samp[0] == 1)) {
      in_RDI->m_scan_type = 2;
      in_RDI->m_max_blocks_per_mcu = 4;
      in_RDI->m_max_mcu_x_size = 0x10;
      in_RDI->m_max_mcu_y_size = 8;
    }
    else if ((in_RDI->m_comp_h_samp[0] == 1) && (in_RDI->m_comp_v_samp[0] == 2)) {
      in_RDI->m_scan_type = 3;
      in_RDI->m_max_blocks_per_mcu = 4;
      in_RDI->m_max_mcu_x_size = 8;
      in_RDI->m_max_mcu_y_size = 0x10;
    }
    else {
      if ((in_RDI->m_comp_h_samp[0] != 2) || (in_RDI->m_comp_v_samp[0] != 2)) {
        stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      status);
      }
      in_RDI->m_scan_type = 4;
      in_RDI->m_max_blocks_per_mcu = 6;
      in_RDI->m_max_mcu_x_size = 0x10;
      in_RDI->m_max_mcu_y_size = 0x10;
    }
  }
  in_RDI->m_max_mcus_per_row =
       (in_RDI->m_image_x_size + in_RDI->m_max_mcu_x_size + -1) / in_RDI->m_max_mcu_x_size;
  in_RDI->m_max_mcus_per_col =
       (in_RDI->m_image_y_size + in_RDI->m_max_mcu_y_size + -1) / in_RDI->m_max_mcu_y_size;
  if (in_RDI->m_scan_type == 0) {
    in_RDI->m_dest_bytes_per_pixel = 1;
  }
  else {
    in_RDI->m_dest_bytes_per_pixel = 4;
  }
  in_RDI->m_dest_bytes_per_scan_line =
       (in_RDI->m_image_x_size + 0xfU & 0xfff0) * in_RDI->m_dest_bytes_per_pixel;
  in_RDI->m_real_dest_bytes_per_scan_line = in_RDI->m_image_x_size * in_RDI->m_dest_bytes_per_pixel;
  puVar1 = (uint8 *)alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
  in_RDI->m_pScan_line_0 = puVar1;
  if ((in_RDI->m_scan_type == 3) || (in_RDI->m_scan_type == 4)) {
    puVar1 = (uint8 *)alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
    in_RDI->m_pScan_line_1 = puVar1;
  }
  in_RDI->m_max_blocks_per_row = in_RDI->m_max_mcus_per_row * in_RDI->m_max_blocks_per_mcu;
  if (in_RDI->m_max_blocks_per_row < 0x2001) {
    pjVar2 = (jpgd_block_t *)alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
    in_RDI->m_pMCU_coefficients = pjVar2;
    for (iVar3 = 0; iVar3 < in_RDI->m_max_blocks_per_mcu; iVar3 = iVar3 + 1) {
      in_RDI->m_mcu_block_max_zag[iVar3] = 0x40;
    }
    in_RDI->m_expanded_blocks_per_component = in_RDI->m_comp_h_samp[0] * in_RDI->m_comp_v_samp[0];
    in_RDI->m_expanded_blocks_per_mcu =
         in_RDI->m_expanded_blocks_per_component * in_RDI->m_comps_in_frame;
    in_RDI->m_expanded_blocks_per_row =
         in_RDI->m_max_mcus_per_row * in_RDI->m_expanded_blocks_per_mcu;
    in_RDI->m_freq_domain_chroma_upsample = false;
    in_RDI->m_freq_domain_chroma_upsample = in_RDI->m_expanded_blocks_per_mcu == 0xc;
    if ((in_RDI->m_freq_domain_chroma_upsample & 1U) == 0) {
      puVar1 = (uint8 *)alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
      in_RDI->m_pSample_buf = puVar1;
    }
    else {
      puVar1 = (uint8 *)alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
      in_RDI->m_pSample_buf = puVar1;
    }
    in_RDI->m_total_lines_left = in_RDI->m_image_y_size;
    in_RDI->m_mcu_lines_left = 0;
    create_look_ups(in_RDI);
    return;
  }
  stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                (jpgd_status)((ulong)in_RDI >> 0x20));
}

Assistant:

void jpeg_decoder::init_frame() {
  int i;

  if (m_comps_in_frame == 1) {
    if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    m_scan_type = JPGD_GRAYSCALE;
    m_max_blocks_per_mcu = 1;
    m_max_mcu_x_size = 8;
    m_max_mcu_y_size = 8;
  } else if (m_comps_in_frame == 3) {
    if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
        ((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH1V1;

      m_max_blocks_per_mcu = 3;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH2V1;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH1V2;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 16;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH2V2;
      m_max_blocks_per_mcu = 6;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 16;
    } else
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
  } else
    stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

  m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
  m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

  // These values are for the *destination* pixels: after conversion.
  if (m_scan_type == JPGD_GRAYSCALE)
    m_dest_bytes_per_pixel = 1;
  else
    m_dest_bytes_per_pixel = 4;

  m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

  m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

  // Initialize two scan line buffers.
  m_pScan_line_0 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);
  if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
    m_pScan_line_1 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);

  m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

  // Should never happen
  if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
    stop_decoding(JPGD_ASSERTION_ERROR);

  // Allocate the coefficient buffer, enough for one MCU
  m_pMCU_coefficients = (jpgd_block_t*)alloc(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_t));

  for (i = 0; i < m_max_blocks_per_mcu; i++)
    m_mcu_block_max_zag[i] = 64;

  m_expanded_blocks_per_component = m_comp_h_samp[0] * m_comp_v_samp[0];
  m_expanded_blocks_per_mcu = m_expanded_blocks_per_component * m_comps_in_frame;
  m_expanded_blocks_per_row = m_max_mcus_per_row * m_expanded_blocks_per_mcu;
  // Freq. domain chroma upsampling is only supported for H2V2 subsampling factor (the most common one I've seen).
  m_freq_domain_chroma_upsample = false;
#if JPGD_SUPPORT_FREQ_DOMAIN_UPSAMPLING
  m_freq_domain_chroma_upsample = (m_expanded_blocks_per_mcu == 4 * 3);
#endif

  if (m_freq_domain_chroma_upsample)
    m_pSample_buf = (uint8*)alloc(m_expanded_blocks_per_row * 64);
  else
    m_pSample_buf = (uint8*)alloc(m_max_blocks_per_row * 64);

  m_total_lines_left = m_image_y_size;

  m_mcu_lines_left = 0;

  create_look_ups();
}